

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void container_suite::test_array_end(void)

{
  bool bVar1;
  encoder_type encoder;
  ostringstream result;
  char local_1cc [4];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined **local_1a8;
  ostringstream *local_1a0;
  long local_180 [4];
  int aiStack_160 [20];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
  local_1a8 = &PTR__base_00118c10;
  bVar1 = *(int *)((long)aiStack_160 + *(long *)(local_180[0] + -0x18)) == 0;
  local_1a0 = (ostringstream *)local_180;
  if (bVar1) {
    local_1cc[0] = 0x5d;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_180,local_1cc,1);
  }
  local_1c8[0] = (long *)(ulong)bVar1;
  local_1cc[0] = '\x01';
  local_1cc[1] = '\0';
  local_1cc[2] = '\0';
  local_1cc[3] = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::end_array>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x371,"void container_suite::test_array_end()",local_1c8,local_1cc);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("result.str()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x372,"void container_suite::test_array_end()",local_1c8,"]");
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  (*(code *)*local_1a8)();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_array_end()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::end_array>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "]");
}